

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d4f480::TransformSelectorRegex::~TransformSelectorRegex
          (TransformSelectorRegex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  
  (this->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorRegex_007120f0;
  pcVar2 = (this->Regex).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelector_00712150;
  pcVar3 = (this->super_TransformSelector).Tag._M_dataplus._M_p;
  paVar1 = &(this->super_TransformSelector).Tag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xf8);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }